

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef
CompileLlvmExternalFunctionWrapper(LlvmCompilationContext *ctx,FunctionData *functionData)

{
  VariableHandle *pVVar1;
  VariableData *pVVar2;
  TypeBase *type;
  LLVMValueRef pLVar3;
  FunctionData *pFVar4;
  FunctionData *pFVar5;
  int iVar6;
  int iVar7;
  LLVMValueRefOpaque **ppLVar8;
  TypeBase *pTVar9;
  IntrusiveList<VariableHandle> *pIVar10;
  LLVMValueRefOpaque *local_98;
  TypeBase *local_90;
  TypeBase *local_88;
  FunctionData *local_80;
  SmallArray<LLVMValueRefOpaque_*,_3U> arguments;
  
  ppLVar8 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                      (&ctx->functions,functionData->functionIndex);
  pLVar3 = ctx->currentFunction;
  pFVar4 = ctx->currentFunctionSource;
  ctx->currentFunction = *ppLVar8;
  ctx->currentFunctionSource = functionData;
  local_90 = functionData->type->returnType;
  iVar6 = 0;
  if (local_90 == (TypeBase *)0x0) {
    local_90 = (TypeBase *)0x0;
  }
  else if (local_90->typeID - 2 < 3) {
    local_90 = ctx->ctx->typeInt;
  }
  local_88 = ctx->ctx->typeVoid;
  pIVar10 = &functionData->argumentVariables;
  local_80 = functionData;
  while (pFVar5 = local_80, pVVar1 = pIVar10->head, pVVar1 != (VariableHandle *)0x0) {
    pVVar2 = pVVar1->variable;
    pTVar9 = pVVar2->type;
    if (pTVar9 == (TypeBase *)0x0) {
      pTVar9 = (TypeBase *)0x0;
    }
    else if (pTVar9->typeID - 2 < 3) {
      pTVar9 = ctx->ctx->typeInt;
    }
    CompileLlvmType(ctx,pTVar9);
    if (pTVar9 != pVVar2->type) {
      CompileLlvmType(ctx,pTVar9);
    }
    iVar7 = (int)pTVar9->size;
    if (pTVar9->size == 0) {
      iVar7 = 4;
    }
    iVar6 = iVar7 + iVar6;
    pIVar10 = (IntrusiveList<VariableHandle> *)&pVVar1->next;
  }
  pVVar2 = local_80->contextArgument;
  if (pVVar2 == (VariableData *)0x0) {
    iVar7 = 8;
  }
  else {
    CompileLlvmType(ctx,local_80->contextType);
    CompileLlvmType(ctx,pVVar2->type);
    iVar7 = (int)pVVar2->type->size;
  }
  pTVar9 = local_90;
  if (iVar7 + iVar6 == (int)pFVar5->argumentsSize) {
    if (pFVar5->coroutine != true) {
      arguments.allocator = ctx->allocator;
      arguments.data = arguments.little;
      arguments.count = 0;
      arguments.max = 3;
      CompileLlvmType(ctx,ctx->ctx->typeInt);
      local_98 = (LLVMValueRefOpaque *)&placeholderValue;
      SmallArray<LLVMValueRefOpaque_*,_3U>::push_back(&arguments,&local_98);
      CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
      local_98 = (LLVMValueRefOpaque *)&placeholderValue;
      SmallArray<LLVMValueRefOpaque_*,_3U>::push_back(&arguments,&local_98);
      if (pTVar9 == local_88) {
        CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
        local_98 = (LLVMValueRefOpaque *)&placeholderValue;
        SmallArray<LLVMValueRefOpaque_*,_3U>::push_back(&arguments,&local_98);
      }
      else {
        CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
        local_98 = (LLVMValueRefOpaque *)&placeholderValue;
        SmallArray<LLVMValueRefOpaque_*,_3U>::push_back(&arguments,&local_98);
      }
      SmallArray<LLVMValueRefOpaque_*,_3U>::~SmallArray(&arguments);
      if (pFVar5->type->returnType != ctx->ctx->typeVoid) {
        CompileLlvmType(ctx,pTVar9);
        type = pFVar5->type->returnType;
        if (pTVar9 != type) {
          CompileLlvmType(ctx,type);
        }
      }
      ctx->currentFunction = pLVar3;
      ctx->currentFunctionSource = pFVar4;
      return (LLVMValueRef)0x0;
    }
    __assert_fail("!functionData->coroutine",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x954,
                  "LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &, FunctionData *)"
                 );
  }
  __assert_fail("argBufferPos == unsigned(functionData->argumentsSize)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x952,
                "LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &, FunctionData *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &ctx, FunctionData *functionData)
{
	LLVMValueRef function = ctx.functions[functionData->functionIndex];

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = functionData;

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Create argument buffer
	LLVMValueRef argBuffer = LLVMBuildAlloca(ctx.builder, LLVMArrayType(LLVMInt8TypeInContext(ctx.context), unsigned(functionData->argumentsSize)), "arg_buffer");

	// Return small numeric types as 'int'
	TypeBase *returnType = functionData->type->returnType;

	if(isType<TypeBool>(returnType) || isType<TypeChar>(returnType) || isType<TypeShort>(returnType))
		returnType = ctx.ctx.typeInt;

	// Create return buffer
	LLVMValueRef retBuffer = returnType == ctx.ctx.typeVoid ? NULL : LLVMBuildAlloca(ctx.builder, LLVMArrayType(LLVMInt8TypeInContext(ctx.context), unsigned(returnType->size)), "ret_buffer");

	// Copy all arguments into argument buffer
	unsigned argIndex = 0;
	unsigned argBufferPos = 0;

	if(IsStructReturnType(functionData->type->returnType))
		argIndex++;

	for(VariableHandle *curr = functionData->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), argBufferPos, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, argBuffer, indices, 2, "");

		TypeBase *argumentType = variable->type;

		// Pass small numeric types as 'int'
		if(isType<TypeBool>(argumentType) || isType<TypeChar>(argumentType) || isType<TypeShort>(argumentType))
			argumentType = ctx.ctx.typeInt;

		LLVMValueRef target = LLVMBuildPointerCast(ctx.builder, address, LLVMPointerType(CompileLlvmType(ctx, argumentType), 0), "arg_buffer_pos");

		if(IsStructArgumentType(argumentType))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, LLVMBuildLoad(ctx.builder, argument, ""), target);
		}
		else
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			if(argumentType != variable->type)
			{
				if(isType<TypeBool>(variable->type))
					argument = LLVMBuildZExt(ctx.builder, argument, CompileLlvmType(ctx, argumentType), "");
				else
					argument = LLVMBuildSExt(ctx.builder, argument, CompileLlvmType(ctx, argumentType), "");
			}

			LLVMBuildStore(ctx.builder, argument, target);
		}

		argBufferPos += argumentType->size == 0 ? 4u : unsigned(argumentType->size);
	}

	if(VariableData *variable = functionData->contextArgument)
	{
		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), argBufferPos, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, argBuffer, indices, 2, "");

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, functionData->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, LLVMBuildPointerCast(ctx.builder, address, LLVMPointerType(CompileLlvmType(ctx, variable->type), 0), "arg_buffer_pos"));

		argBufferPos += unsigned(variable->type->size);
	}
	else
	{
		argBufferPos += NULLC_PTR_SIZE;
	}

	assert(argBufferPos == unsigned(functionData->argumentsSize));

	assert(!functionData->coroutine);

	// Call helper function
	{
		SmallArray<LLVMValueRef, 3> arguments(ctx.allocator);

		arguments.push_back(LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), functionData->functionIndex, true));
		arguments.push_back(LLVMBuildPointerCast(ctx.builder, argBuffer, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "arg_buffer_raw_ptr"));

		if(retBuffer)
			arguments.push_back(LLVMBuildPointerCast(ctx.builder, retBuffer, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "ret_buffer_raw_ptr"));
		else
			arguments.push_back(LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)));

		LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmExternalCall"), arguments.data, arguments.count, "");
	}

	if(functionData->type->returnType == ctx.ctx.typeVoid)
	{
		LLVMBuildRetVoid(ctx.builder);
	}
	else if(IsStructReturnType(functionData->type->returnType))
	{
		LLVMValueRef result = LLVMBuildLoad(ctx.builder, LLVMBuildPointerCast(ctx.builder, retBuffer, LLVMPointerType(CompileLlvmType(ctx, functionData->type->returnType), 0), "result_ptr"), "result");

		LLVMValueRef argument = LLVMGetParam(function, 0);

		LLVMBuildStore(ctx.builder, result, argument);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		LLVMValueRef result = LLVMBuildLoad(ctx.builder, LLVMBuildPointerCast(ctx.builder, retBuffer, LLVMPointerType(CompileLlvmType(ctx, returnType), 0), "result_ptr"), "result");

		if(returnType != functionData->type->returnType)
			result = LLVMBuildTrunc(ctx.builder, result, CompileLlvmType(ctx, functionData->type->returnType), "");

		LLVMBuildRet(ctx.builder, result);
	}

	CheckFunction(ctx, ctx.currentFunction, functionData->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	return NULL;
}